

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void __thiscall cppcms::filters::date::date(date *this,streamable *t)

{
  long in_RDI;
  streamable *in_stack_ffffffffffffffc8;
  streamable *in_stack_ffffffffffffffd0;
  
  streamable::streamable(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::string((string *)(in_RDI + 0x20));
  booster::copy_ptr<cppcms::filters::date::_data>::copy_ptr
            ((copy_ptr<cppcms::filters::date::_data> *)(in_RDI + 0x40));
  return;
}

Assistant:

date::date(streamable const &t) : time_(t) {}